

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  tdefl_status tVar1;
  mz_bool mVar2;
  mz_ulong mVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  tdefl_put_buf_func_ptr in_RDI;
  long *in_R8;
  uint in_R9D;
  int in_stack_00000008;
  mz_uint8 pnghdr [41];
  mz_uint32 c;
  int z;
  int y;
  int bpl;
  int i;
  tdefl_output_buffer out_buf;
  tdefl_compressor *pComp;
  tdefl_flush in_stack_ffffffffffffff3c;
  void *in_stack_ffffffffffffff40;
  tdefl_put_buf_func_ptr in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar4;
  void *in_stack_ffffffffffffff58;
  void *pUser;
  int len;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff6b;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 uVar9;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 uVar11;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar12;
  mz_uint8 local_8c [7];
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  mz_uint8 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b [5];
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  int local_6c;
  int local_68;
  tdefl_flush local_64;
  int local_60;
  int local_5c;
  long local_58;
  size_t local_50;
  void *local_48;
  undefined4 local_40;
  void *local_38;
  uint local_2c;
  long *local_28;
  int local_1c;
  int local_18;
  int local_14;
  tdefl_put_buf_func_ptr local_10;
  void *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_38 = malloc(0x4df78);
  local_60 = local_14 * local_1c;
  *local_28 = 0;
  if (local_38 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    memset(&local_58,0,0x20);
    local_40 = 1;
    if ((local_60 + 1) * local_18 < 0x40) {
      len = 0x40;
    }
    else {
      len = (local_60 + 1) * local_18;
    }
    local_50 = (size_t)(len + 0x39);
    local_48 = malloc(local_50);
    if (local_48 == (void *)0x0) {
      free(local_38);
      local_8 = (void *)0x0;
    }
    else {
      for (local_68 = 0x29; local_68 != 0; local_68 = local_68 + -1) {
        tdefl_output_buffer_putter
                  ((void *)CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               CONCAT13(in_stack_ffffffffffffff6b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  CONCAT11(in_stack_ffffffffffffff69,
                                                           in_stack_ffffffffffffff68))))))),len,
                   in_stack_ffffffffffffff58);
      }
      uVar4 = local_2c;
      if (10 < local_2c) {
        uVar4 = 10;
      }
      pUser = local_38;
      tdefl_init((tdefl_compressor *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      for (local_64 = TDEFL_NO_FLUSH; (int)local_64 < local_18; local_64 = local_64 + 1) {
        tdefl_compress_buffer
                  ((tdefl_compressor *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff3c);
        in_stack_ffffffffffffff3c = local_64;
        if (in_stack_00000008 != 0) {
          in_stack_ffffffffffffff3c = (local_18 + -1) - local_64;
        }
        in_stack_ffffffffffffff40 = local_38;
        in_stack_ffffffffffffff48 = local_10;
        tdefl_compress_buffer
                  ((tdefl_compressor *)CONCAT44(uVar4,in_stack_ffffffffffffff50),local_10,
                   (size_t)local_38,in_stack_ffffffffffffff3c);
      }
      tVar1 = tdefl_compress_buffer
                        ((tdefl_compressor *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff3c);
      if (tVar1 == TDEFL_STATUS_DONE) {
        *local_28 = local_58 + -0x29;
        uVar5 = 0x89;
        uVar6 = 0x50;
        uVar7 = 0x4e;
        uVar8 = 0x47;
        uVar9 = 0xd;
        uVar10 = 10;
        uVar11 = 0x1a;
        uVar12 = 10;
        builtin_memcpy(local_8c,"IHDR",5);
        local_8c[5] = 0;
        local_8c[6] = (mz_uint8)((ushort)(undefined2)local_14 >> 8);
        local_85 = (undefined1)(undefined2)local_14;
        local_84 = 0;
        local_83 = 0;
        local_82 = (undefined1)((uint)local_18 >> 8);
        local_81 = (undefined1)local_18;
        local_80 = 8;
        local_7f = ""[local_1c];
        local_7e = 0;
        local_7d = 0;
        local_7c = 0;
        local_7b[0] = 0;
        local_7b[1] = 0;
        local_7b[2] = 0;
        local_7b[3] = 0;
        local_7b[4] = (undefined1)((ulong)*local_28 >> 0x18);
        local_76 = (undefined1)((ulong)*local_28 >> 0x10);
        local_75 = (undefined1)((ulong)*local_28 >> 8);
        local_74 = (undefined1)*local_28;
        local_73 = 0x49;
        local_72 = 0x44;
        local_71 = 0x41;
        local_70 = 0x54;
        mVar3 = mz_crc32(0,local_8c,0x11);
        local_6c = (int)mVar3;
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          local_7b[local_5c] = (char)((uint)local_6c >> 0x18);
          local_6c = local_6c << 8;
        }
        __wrap_memcpy((void *)CONCAT44(uVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
                      (size_t)in_stack_ffffffffffffff40);
        mVar2 = tdefl_output_buffer_putter
                          ((void *)CONCAT17(uVar12,CONCAT16(uVar11,CONCAT15(uVar10,CONCAT14(uVar9,
                                                  CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5
                                                                                        ))))))),len,
                           pUser);
        if (mVar2 == 0) {
          *local_28 = 0;
          free(local_38);
          free(local_48);
          local_8 = (void *)0x0;
        }
        else {
          mVar3 = mz_crc32(0,(mz_uint8 *)((long)local_48 + 0x25),*local_28 + 4);
          local_6c = (int)mVar3;
          for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
            *(char *)((long)local_48 + (long)local_5c + local_58 + -0x10) =
                 (char)((uint)local_6c >> 0x18);
            local_6c = local_6c << 8;
          }
          *local_28 = *local_28 + 0x39;
          free(local_38);
          local_8 = local_48;
        }
      }
      else {
        free(local_38);
        free(local_48);
        local_8 = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w, int h, int num_chans, size_t *pLen_out, mz_uint level, mz_bool flip)
{
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was defined.
  static const mz_uint s_tdefl_png_num_probes[11] = { 0, 1, 6, 32,  16, 32, 128, 256,  512, 768, 1500 };
  tdefl_compressor *pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor)); tdefl_output_buffer out_buf; int i, bpl = w * num_chans, y, z; mz_uint32 c; *pLen_out = 0;
  if (!pComp) return NULL;
  MZ_CLEAR_OBJ(out_buf); out_buf.m_expandable = MZ_TRUE; out_buf.m_capacity = 57+MZ_MAX(64, (1+bpl)*h); if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) { MZ_FREE(pComp); return NULL; }
  // write dummy header
  for (z = 41; z; --z) tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, s_tdefl_png_num_probes[MZ_MIN(10, level)] | TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) { tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH); tdefl_compress_buffer(pComp, (mz_uint8*)pImage + (flip ? (h - 1 - y) : y) * bpl, bpl, TDEFL_NO_FLUSH); }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) { MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  // write real header
  *pLen_out = out_buf.m_size-41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41]={0x89,0x50,0x4e,0x47,0x0d,0x0a,0x1a,0x0a,0x00,0x00,0x00,0x0d,0x49,0x48,0x44,0x52,
      0,0,(mz_uint8)(w>>8),(mz_uint8)w,0,0,(mz_uint8)(h>>8),(mz_uint8)h,8,chans[num_chans],0,0,0,0,0,0,0,
      (mz_uint8)(*pLen_out>>24),(mz_uint8)(*pLen_out>>16),(mz_uint8)(*pLen_out>>8),(mz_uint8)*pLen_out,0x49,0x44,0x41,0x54};
    c=(mz_uint32)mz_crc32(MZ_CRC32_INIT,pnghdr+12,17); for (i=0; i<4; ++i, c<<=8) ((mz_uint8*)(pnghdr+29))[i]=(mz_uint8)(c>>24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) { *pLen_out = 0; MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT,out_buf.m_pBuf+41-4, *pLen_out+4); for (i=0; i<4; ++i, c<<=8) (out_buf.m_pBuf+out_buf.m_size-16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57; MZ_FREE(pComp); return out_buf.m_pBuf;
}